

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  int iVar2;
  TValue *pTVar3;
  MRef MVar4;
  uint key_00;
  
  t->nomm = '\0';
  dVar1 = key->n;
  if ((long)dVar1 >> 0x2f == 0xfffffffffffffffb) {
    pTVar3 = lj_tab_setstr(L,t,(GCstr *)((ulong)dVar1 & 0x7fffffffffff));
    return pTVar3;
  }
  if ((ulong)((long)dVar1 >> 0x2f) < 0xfffffffffffffff2) {
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      key_00 = (uint)dVar1;
      if (key_00 < t->asize) {
        return (TValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
      }
      pTVar3 = lj_tab_setinth(L,t,key_00);
      return pTVar3;
    }
    if (NAN(dVar1)) {
      lj_err_msg(L,LJ_ERR_NANIDX);
    }
  }
  else if (dVar1 == -NAN) {
    lj_err_msg(L,LJ_ERR_NILIDX);
  }
  MVar4.ptr64 = (uint64_t)hashkey(t,key);
  do {
    iVar2 = lj_obj_equal((cTValue *)(MVar4.ptr64 + 8),key);
    if (iVar2 != 0) {
      return (TValue *)MVar4.ptr64;
    }
    MVar4.ptr64 = ((TValue *)(MVar4.ptr64 + 0x10))->u64;
  } while (MVar4.ptr64 != 0);
  pTVar3 = lj_tab_newkey(L,t,key);
  return pTVar3;
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}